

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O2

int __thiscall
ncnn::Proposal::forward
          (Proposal *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  uint uVar7;
  uint uVar8;
  uint _c;
  pointer pMVar9;
  void *pvVar10;
  undefined8 *puVar11;
  unsigned_long uVar12;
  Mat *this_00;
  size_t sVar13;
  long lVar14;
  int *piVar15;
  ulong uVar16;
  uint _h;
  ulong uVar17;
  undefined1 (*pauVar18) [16];
  pointer pRVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  void *pvVar23;
  undefined1 (*pauVar24) [16];
  long lVar25;
  size_t j_1;
  void *pvVar26;
  value_type_conflict *__x;
  int j;
  ulong uVar27;
  float *pfVar28;
  int q;
  void *pvVar29;
  pointer pRVar30;
  int _c_00;
  void *pvVar31;
  long lVar32;
  ulong uVar33;
  bool bVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar38 [16];
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> proposal_boxes;
  undefined1 (*local_208) [16];
  ulong local_200;
  float local_1f4;
  float local_1f0;
  float local_1ec;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  Rect r;
  vector<float,_std::allocator<float>_> scores;
  long local_180;
  long local_170;
  long local_168;
  long local_160;
  undefined1 (*local_158) [16];
  Mat local_148;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  long local_e0;
  long local_d8;
  ulong local_d0;
  ulong local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  ulong local_a8;
  ulong local_a0;
  long local_98;
  ulong local_90;
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  float local_58;
  undefined1 local_48 [24];
  
  pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = pMVar9->w;
  uVar8 = pMVar9->h;
  _c = (this->anchors).h;
  local_148.cstep = 0;
  _h = uVar8 * uVar7;
  local_148.data = (undefined1 (*) [16])0x0;
  local_148.refcount._0_4_ = 0;
  local_148.refcount._4_4_ = 0;
  local_148.elemsize._0_4_ = 0;
  local_148.elemsize._4_4_ = 0;
  local_148.elempack = 0;
  local_148.allocator = (Allocator *)0x0;
  local_148.dims = 0;
  local_148.w = 0;
  local_148.h = 0;
  local_148.d = 0;
  local_148.c = 0;
  uVar27 = 0;
  Mat::create(&local_148,4,_h,_c,4,(Allocator *)0x0);
  local_180 = (long)(int)_c;
  local_158 = (undefined1 (*) [16])local_148.data;
  local_d8 = (long)(this->anchors).w * (this->anchors).elemsize;
  local_90 = 0;
  if (0 < (int)uVar7) {
    local_90 = (ulong)uVar7;
  }
  local_a8 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    local_a8 = uVar27;
  }
  pvVar10 = (this->anchors).data;
  uVar33 = (ulong)_c;
  if ((int)_c < 1) {
    uVar33 = uVar27;
  }
  local_e0 = local_148.cstep * CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize);
  local_98 = (long)local_148.w * CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize);
  local_c0 = local_98 * (int)uVar7;
  local_b8 = (long)(int)uVar7 << 2;
  local_160 = 3;
  local_168 = 2;
  local_170 = 1;
  uVar17 = 0;
  while (uVar17 != uVar33) {
    pvVar23 = pMVar9[1].data;
    local_b0 = local_d8 * uVar17;
    local_f8 = (float)((ulong)*(undefined8 *)((long)pvVar10 + local_b0) >> 0x20);
    uVar5 = *(undefined8 *)((long)pvVar10 + local_b0 + 8);
    local_78 = (float)uVar5 - (float)*(undefined8 *)((long)pvVar10 + local_b0);
    local_88._4_4_ = (float)((ulong)uVar5 >> 0x20) - local_f8;
    local_68 = CONCAT44(local_88._4_4_,local_78);
    local_1f4 = (float)this->feat_stride;
    local_78 = local_78 * 0.5;
    fStack_74 = local_88._4_4_ * 0.5;
    uStack_60 = 0;
    local_88._0_4_ = local_88._4_4_;
    local_88._8_4_ = local_88._4_4_;
    local_88._12_4_ = local_88._4_4_;
    lVar22 = pMVar9[1].cstep * pMVar9[1].elemsize;
    pvVar26 = (void *)(lVar22 * local_160 + (long)pvVar23);
    pvVar29 = (void *)(lVar22 * local_168 + (long)pvVar23);
    pvVar31 = (void *)(lVar22 * local_170 + (long)pvVar23);
    pvVar23 = (void *)(lVar22 * uVar27 + (long)pvVar23);
    local_208 = local_158;
    uVar16 = 0;
    fStack_f4 = local_f8;
    fStack_f0 = local_f8;
    fStack_ec = local_f8;
    local_d0 = uVar17;
    local_c8 = uVar27;
    fStack_70 = local_78;
    fStack_6c = fStack_74;
    while (uVar16 != local_a8) {
      local_1f0 = (float)this->feat_stride;
      fVar39 = *(float *)((long)pvVar10 + local_b0);
      pauVar18 = local_208;
      local_a0 = uVar16;
      for (uVar27 = 0; local_90 != uVar27; uVar27 = uVar27 + 1) {
        local_1ec = *(float *)((long)pvVar26 + uVar27 * 4);
        local_48._4_4_ = 0;
        local_48._0_4_ = (*(float *)((long)pvVar31 + uVar27 * 4) + 0.5) * (float)local_88._0_4_;
        local_48._8_4_ = (*(float *)((long)pvVar23 + uVar27 * 4) + 0.5) * (float)local_68;
        local_48._12_4_ = 0;
        local_58 = expf(*(float *)((long)pvVar29 + uVar27 * 4));
        fVar35 = expf(local_1ec);
        *(float *)*pauVar18 = ((float)local_48._8_4_ + fVar39) - local_58 * fStack_70;
        *(float *)(*pauVar18 + 4) = ((float)local_48._0_4_ + local_f8) - fVar35 * fStack_6c;
        *(float *)(*pauVar18 + 8) = (float)local_48._8_4_ + fVar39 + local_58 * fStack_70;
        *(float *)(*pauVar18 + 0xc) = (float)local_48._0_4_ + local_f8 + fVar35 * fStack_6c;
        fVar39 = fVar39 + local_1f0;
        pauVar18 = (undefined1 (*) [16])(*pauVar18 + local_98);
      }
      local_f8 = local_f8 + local_1f4;
      pvVar26 = (void *)((long)pvVar26 + local_b8);
      pvVar29 = (void *)((long)pvVar29 + local_b8);
      pvVar31 = (void *)((long)pvVar31 + local_b8);
      pvVar23 = (void *)((long)pvVar23 + local_b8);
      local_208 = (undefined1 (*) [16])(*local_208 + local_c0);
      uVar16 = local_a0 + 1;
    }
    local_160 = local_160 + 4;
    local_168 = local_168 + 4;
    local_170 = local_170 + 4;
    uVar27 = local_c8 + 4;
    local_158 = (undefined1 (*) [16])(*local_158 + local_e0);
    uVar17 = local_d0 + 1;
  }
  puVar11 = (undefined8 *)pMVar9[2].data;
  uVar5 = *puVar11;
  fVar39 = (float)uVar5;
  fVar35 = (float)((ulong)uVar5 >> 0x20);
  uVar17 = 0;
  uVar27 = (ulong)_h;
  if ((int)_h < 1) {
    uVar27 = uVar17;
  }
  pauVar18 = (undefined1 (*) [16])local_148.data;
  for (; pauVar24 = pauVar18, uVar16 = uVar27, uVar17 != uVar33; uVar17 = uVar17 + 1) {
    while (uVar16 != 0) {
      auVar38._4_4_ = fVar39 + -1.0;
      auVar38._0_4_ = fVar35 + -1.0;
      auVar38._8_4_ = fVar35 + -1.0;
      auVar38._12_4_ = fVar39 + -1.0;
      auVar38 = minps(*pauVar24,auVar38);
      auVar38 = maxps(auVar38,ZEXT816(0));
      *pauVar24 = auVar38;
      pauVar24 = (undefined1 (*) [16])
                 (*pauVar24 +
                 (long)local_148.w *
                 CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize));
      uVar16 = uVar16 - 1;
    }
    pauVar18 = (undefined1 (*) [16])
               (*pauVar18 +
               CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize) * local_148.cstep);
  }
  proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  fVar39 = (float)this->min_size * *(float *)(puVar11 + 1);
  for (uVar17 = 0; uVar17 != uVar33; uVar17 = uVar17 + 1) {
    lVar32 = (long)local_148.w;
    lVar22 = CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize);
    pfVar28 = (float *)((undefined1 *)local_148.data + lVar22 * local_148.cstep * uVar17 + 0xc);
    __x = (value_type_conflict *)(pMVar9->cstep * pMVar9->elemsize * local_180 + (long)pMVar9->data)
    ;
    uVar16 = uVar27;
    while (bVar34 = uVar16 != 0, uVar16 = uVar16 - 1, bVar34) {
      if ((fVar39 <= (pfVar28[-1] + 1.0) - pfVar28[-3]) &&
         (fVar39 <= (*pfVar28 + 1.0) - pfVar28[-2])) {
        r.y1 = pfVar28[-2];
        r.x2 = pfVar28[-1];
        r.y2 = *pfVar28;
        r.x1 = pfVar28[-3];
        std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::push_back(&proposal_boxes,&r);
        std::vector<float,_std::allocator<float>_>::push_back(&scores,__x);
      }
      pfVar28 = (float *)((long)pfVar28 + lVar32 * lVar22);
      __x = __x + 1;
    }
    local_180 = local_180 + 1;
  }
  if ((proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
       super__Vector_impl_data._M_start !=
       proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     (scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    qsort_descent_inplace<ncnn::Rect>
              (&proposal_boxes,&scores,0,
               (int)((ulong)((long)scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2) + -1);
  }
  iVar21 = this->pre_nms_topN;
  if ((0 < (long)iVar21) &&
     (iVar21 < (int)((ulong)((long)proposal_boxes.
                                   super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)proposal_boxes.
                                  super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 4))) {
    std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::resize(&proposal_boxes,(long)iVar21);
    std::vector<float,_std::allocator<float>_>::resize(&scores,(long)this->pre_nms_topN);
  }
  picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fVar39 = this->nms_thresh;
  uVar33 = (long)proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                 super__Vector_impl_data._M_start >> 4;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&r,uVar33,(allocator_type *)&local_200);
  pfVar28 = &(proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
              super__Vector_impl_data._M_start)->x2;
  for (uVar27 = 0; uVar33 != uVar27; uVar27 = uVar27 + 1) {
    uVar4 = ((Rect *)(pfVar28 + -2))->x1;
    uVar6 = ((Rect *)(pfVar28 + -2))->y1;
    *(float *)(CONCAT44(r.y1,r.x1) + uVar27 * 4) =
         ((float)((ulong)*(undefined8 *)pfVar28 >> 0x20) - (float)uVar6) *
         ((float)*(undefined8 *)pfVar28 - (float)uVar4);
    pfVar28 = pfVar28 + 4;
  }
  for (local_200 = 0; local_200 < uVar33; local_200 = local_200 + 1) {
    pRVar19 = proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
              super__Vector_impl_data._M_start + local_200;
    bVar34 = true;
    for (lVar22 = 0;
        (long)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != lVar22; lVar22 = lVar22 + 1) {
      uVar12 = picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar22];
      fVar35 = pRVar19->x1;
      fVar37 = proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_start[uVar12].x2;
      fVar36 = 0.0;
      if (fVar35 <= fVar37) {
        pRVar30 = proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl
                  .super__Vector_impl_data._M_start + uVar12;
        fVar1 = pRVar19->x2;
        fVar41 = pRVar30->x1;
        if (fVar41 <= fVar1) {
          fVar2 = pRVar19->y1;
          fVar40 = pRVar30->y2;
          if (fVar2 <= fVar40) {
            fVar3 = pRVar19->y2;
            fVar42 = pRVar30->y1;
            if (fVar42 <= fVar3) {
              if (fVar1 <= fVar37) {
                fVar37 = fVar1;
              }
              if (fVar41 <= fVar35) {
                fVar41 = fVar35;
              }
              if (fVar3 <= fVar40) {
                fVar40 = fVar3;
              }
              if (fVar42 <= fVar2) {
                fVar42 = fVar2;
              }
              fVar36 = (fVar40 - fVar42) * (fVar37 - fVar41);
            }
          }
        }
      }
      if (fVar39 < fVar36 / ((*(float *)(CONCAT44(r.y1,r.x1) + local_200 * 4) - fVar36) +
                            *(float *)(CONCAT44(r.y1,r.x1) + uVar12 * 4))) {
        bVar34 = false;
      }
    }
    if (bVar34) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&picked,&local_200);
    }
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&r);
  uVar27 = (ulong)((long)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start) >> 3;
  uVar33 = uVar27 & 0xffffffff;
  if (this->after_nms_topN < (int)uVar27) {
    uVar33 = (ulong)(uint)this->after_nms_topN;
  }
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  _c_00 = (int)uVar33;
  Mat::create(this_00,4,1,_c_00,4,(Allocator *)0x0);
  iVar20 = -100;
  iVar21 = iVar20;
  if ((this_00->data != (void *)0x0) && (sVar13 = this_00->cstep, (long)this_00->c * sVar13 != 0)) {
    lVar22 = 0;
    uVar27 = 0;
    if (0 < _c_00) {
      uVar27 = uVar33;
    }
    for (lVar32 = 0; uVar27 * 8 != lVar32; lVar32 = lVar32 + 8) {
      pvVar10 = this_00->data;
      lVar25 = this_00->elemsize * lVar22;
      lVar14 = *(long *)((long)picked.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar32);
      *(float *)((long)pvVar10 + lVar25) =
           proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
           super__Vector_impl_data._M_start[lVar14].x1;
      *(float *)((long)pvVar10 + lVar25 + 4) =
           proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
           super__Vector_impl_data._M_start[lVar14].y1;
      *(float *)((long)pvVar10 + lVar25 + 8) =
           proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
           super__Vector_impl_data._M_start[lVar14].x2;
      *(float *)((long)pvVar10 + lVar25 + 0xc) =
           proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
           super__Vector_impl_data._M_start[lVar14].y2;
      lVar22 = lVar22 + sVar13;
    }
    pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar21 = 0;
    if (((1 < (ulong)(((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9) / 0x48)) &&
        (Mat::create(pMVar9 + 1,1,1,_c_00,4,(Allocator *)0x0), iVar21 = iVar20,
        pMVar9[1].data != (void *)0x0)) &&
       (sVar13 = pMVar9[1].cstep, (long)pMVar9[1].c * sVar13 != 0)) {
      lVar22 = 0;
      for (lVar32 = 0; iVar21 = 0, uVar27 * 8 != lVar32; lVar32 = lVar32 + 8) {
        *(float *)((long)pMVar9[1].data + pMVar9[1].elemsize * lVar22) =
             scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start
             [*(long *)((long)picked.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar32)];
        lVar22 = lVar22 + sVar13;
      }
    }
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&scores.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>::~_Vector_base
            (&proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>);
  piVar15 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
  if (piVar15 != (int *)0x0) {
    LOCK();
    *piVar15 = *piVar15 + -1;
    UNLOCK();
    if (*piVar15 == 0) {
      if (local_148.allocator == (Allocator *)0x0) {
        free(local_148.data);
      }
      else {
        (*(local_148.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar21;
}

Assistant:

int Proposal::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& score_blob = bottom_blobs[0];
    const Mat& bbox_blob = bottom_blobs[1];
    const Mat& im_info_blob = bottom_blobs[2];

    int w = score_blob.w;
    int h = score_blob.h;

    // generate proposals from bbox deltas and shifted anchors
    const int num_anchors = anchors.h;

    Mat proposals;
    proposals.create(4, w * h, num_anchors);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < num_anchors; q++)
    {
        const float* bbox_xptr = bbox_blob.channel(q * 4);
        const float* bbox_yptr = bbox_blob.channel(q * 4 + 1);
        const float* bbox_wptr = bbox_blob.channel(q * 4 + 2);
        const float* bbox_hptr = bbox_blob.channel(q * 4 + 3);

        Mat pbs = proposals.channel(q);

        const float* anchor = anchors.row(q);

        // shifted anchor
        float anchor_y = anchor[1];

        float anchor_w = anchor[2] - anchor[0];
        float anchor_h = anchor[3] - anchor[1];

        for (int i = 0; i < h; i++)
        {
            float anchor_x = anchor[0];

            for (int j = 0; j < w; j++)
            {
                float* pb = pbs.row(i * w + j);

                // apply center size
                float dx = bbox_xptr[j];
                float dy = bbox_yptr[j];
                float dw = bbox_wptr[j];
                float dh = bbox_hptr[j];

                float cx = anchor_x + anchor_w * 0.5f;
                float cy = anchor_y + anchor_h * 0.5f;

                float pb_cx = cx + anchor_w * dx;
                float pb_cy = cy + anchor_h * dy;

                float pb_w = static_cast<float>(anchor_w * exp(dw));
                float pb_h = static_cast<float>(anchor_h * exp(dh));

                pb[0] = pb_cx - pb_w * 0.5f;
                pb[1] = pb_cy - pb_h * 0.5f;
                pb[2] = pb_cx + pb_w * 0.5f;
                pb[3] = pb_cy + pb_h * 0.5f;

                anchor_x += feat_stride;
            }

            bbox_xptr += w;
            bbox_yptr += w;
            bbox_wptr += w;
            bbox_hptr += w;

            anchor_y += feat_stride;
        }
    }

    // clip predicted boxes to image
    float im_w = im_info_blob[1];
    float im_h = im_info_blob[0];

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            // clip box
            pb[0] = std::max(std::min(pb[0], im_w - 1), 0.f);
            pb[1] = std::max(std::min(pb[1], im_h - 1), 0.f);
            pb[2] = std::max(std::min(pb[2], im_w - 1), 0.f);
            pb[3] = std::max(std::min(pb[3], im_h - 1), 0.f);
        }
    }

    // remove predicted boxes with either height or width < threshold
    std::vector<Rect> proposal_boxes;
    std::vector<float> scores;

    float im_scale = im_info_blob[2];
    float min_boxsize = min_size * im_scale;

    for (int q = 0; q < num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);
        const float* scoreptr = score_blob.channel(q + num_anchors);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            float pb_w = pb[2] - pb[0] + 1;
            float pb_h = pb[3] - pb[1] + 1;

            if (pb_w >= min_boxsize && pb_h >= min_boxsize)
            {
                Rect r = {pb[0], pb[1], pb[2], pb[3]};
                proposal_boxes.push_back(r);
                scores.push_back(scoreptr[i]);
            }
        }
    }

    // sort all (proposal, score) pairs by score from highest to lowest
    qsort_descent_inplace(proposal_boxes, scores);

    // take top pre_nms_topN
    if (pre_nms_topN > 0 && pre_nms_topN < (int)proposal_boxes.size())
    {
        proposal_boxes.resize(pre_nms_topN);
        scores.resize(pre_nms_topN);
    }

    // apply nms with nms_thresh
    std::vector<size_t> picked;
    nms_sorted_bboxes(proposal_boxes, picked, nms_thresh);

    // take after_nms_topN
    int picked_count = std::min((int)picked.size(), after_nms_topN);

    // return the top proposals
    Mat& roi_blob = top_blobs[0];
    roi_blob.create(4, 1, picked_count);
    if (roi_blob.empty())
        return -100;

    for (int i = 0; i < picked_count; i++)
    {
        float* outptr = roi_blob.channel(i);

        outptr[0] = proposal_boxes[picked[i]].x1;
        outptr[1] = proposal_boxes[picked[i]].y1;
        outptr[2] = proposal_boxes[picked[i]].x2;
        outptr[3] = proposal_boxes[picked[i]].y2;
    }

    if (top_blobs.size() > 1)
    {
        Mat& roi_score_blob = top_blobs[1];
        roi_score_blob.create(1, 1, picked_count);
        if (roi_score_blob.empty())
            return -100;

        for (int i = 0; i < picked_count; i++)
        {
            float* outptr = roi_score_blob.channel(i);
            outptr[0] = scores[picked[i]];
        }
    }

    return 0;
}